

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mml.c
# Opt level: O3

int mml_get_length(char **ptr)

{
  int iVar1;
  
  iVar1 = mml_get_value(ptr);
  if (((0x3f < iVar1 - 1U) || ((0x80008000808088afU >> ((ulong)(iVar1 - 1U) & 0x3f) & 1) == 0)) &&
     (iVar1 != 0x60)) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
mml_get_length(char **ptr)
{
	int len;

	len = mml_get_value(ptr);

	switch (len) {
	case  1:
	case  2:
	case  3:
	case  4:
	case  6:
	case  8:
	case 12:
	case 16:
	case 24:
	case 32:
	case 48:
	case 64:
	case 96:
		return (len);

	default:
		return (0);
	}
}